

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_units.cpp
# Opt level: O0

void testBaseLimits(string *tempdir)

{
  ostream *poVar1;
  char *in_RDI;
  char *unaff_retaddr;
  int mxh;
  int mxw;
  char *in_stack_ffffffffffffffe8;
  int local_10;
  uint in_stack_fffffffffffffff4;
  
  exr_set_default_maximum_image_size(0x2a);
  exr_get_default_maximum_image_size(&stack0xfffffffffffffff4,&local_10);
  if ((in_stack_fffffffffffffff4 != 0x2a) || (local_10 != 0x2a)) {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "Unable to set_default_maximum_image_size: 42, 42 -> ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_stack_fffffffffffffff4);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_10);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    core_test_fail(unaff_retaddr,in_RDI,in_stack_fffffffffffffff4,in_stack_ffffffffffffffe8);
  }
  exr_set_default_maximum_image_size(0xffffffff);
  exr_get_default_maximum_image_size(&stack0xfffffffffffffff4,&local_10);
  if ((in_stack_fffffffffffffff4 != 0x2a) || (local_10 != 0x2a)) {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "Invalid request not ignored to set_default_maximum_image_size: 42, 42 -> "
                            );
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_stack_fffffffffffffff4);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_10);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    core_test_fail(unaff_retaddr,in_RDI,in_stack_fffffffffffffff4,in_stack_ffffffffffffffe8);
  }
  exr_set_default_maximum_image_size(0x54,0xffffffff);
  exr_get_default_maximum_image_size(&stack0xfffffffffffffff4,&local_10);
  if ((in_stack_fffffffffffffff4 != 0x2a) || (local_10 != 0x2a)) {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "Invalid request not ignored to set_default_maximum_image_size: 42, 42 -> "
                            );
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_stack_fffffffffffffff4);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_10);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    core_test_fail(unaff_retaddr,in_RDI,in_stack_fffffffffffffff4,in_stack_ffffffffffffffe8);
  }
  exr_set_default_maximum_image_size(0xffffffff,0x54);
  exr_get_default_maximum_image_size(&stack0xfffffffffffffff4,&local_10);
  if ((in_stack_fffffffffffffff4 != 0x2a) || (local_10 != 0x2a)) {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "Invalid request not ignored to set_default_maximum_image_size: 42, 42 -> "
                            );
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_stack_fffffffffffffff4);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_10);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    core_test_fail(unaff_retaddr,in_RDI,in_stack_fffffffffffffff4,in_stack_ffffffffffffffe8);
  }
  exr_set_default_maximum_tile_size(0x80);
  exr_get_default_maximum_tile_size(&stack0xfffffffffffffff4,&local_10);
  if ((in_stack_fffffffffffffff4 != 0x80) || (local_10 != 0x80)) {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "Unable to set_default_maximum_tile_size: 128, 128 -> ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_stack_fffffffffffffff4);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_10);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    core_test_fail(unaff_retaddr,in_RDI,in_stack_fffffffffffffff4,in_stack_ffffffffffffffe8);
  }
  exr_set_default_maximum_tile_size(0xffffffff);
  exr_get_default_maximum_tile_size(&stack0xfffffffffffffff4,&local_10);
  if ((in_stack_fffffffffffffff4 != 0x80) || (local_10 != 0x80)) {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "Invalid request not ignored to set_default_maximum_image_size: 128, 128 -> "
                            );
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_stack_fffffffffffffff4);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_10);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    core_test_fail(unaff_retaddr,in_RDI,in_stack_fffffffffffffff4,in_stack_ffffffffffffffe8);
  }
  exr_set_default_maximum_tile_size(0x54,0xffffffff);
  exr_get_default_maximum_tile_size(&stack0xfffffffffffffff4,&local_10);
  if ((in_stack_fffffffffffffff4 != 0x80) || (local_10 != 0x80)) {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "Invalid request not ignored to set_default_maximum_image_size: 128, 128 -> "
                            );
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_stack_fffffffffffffff4);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_10);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    core_test_fail(unaff_retaddr,in_RDI,in_stack_fffffffffffffff4,in_stack_ffffffffffffffe8);
  }
  exr_set_default_maximum_tile_size(0xffffffff,0x54);
  exr_get_default_maximum_tile_size(&stack0xfffffffffffffff4,&local_10);
  if ((in_stack_fffffffffffffff4 != 0x80) || (local_10 != 0x80)) {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "Invalid request not ignored to set_default_maximum_image_size: 128, 128 -> "
                            );
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_stack_fffffffffffffff4);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_10);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    core_test_fail(unaff_retaddr,in_RDI,in_stack_fffffffffffffff4,in_stack_ffffffffffffffe8);
  }
  exr_set_default_maximum_image_size(0);
  exr_set_default_maximum_tile_size(0);
  return;
}

Assistant:

void
testBaseLimits (const std::string& tempdir)
{
    int mxw, mxh;
    exr_set_default_maximum_image_size (42, 42);
    exr_get_default_maximum_image_size (&mxw, &mxh);
    if (mxw != 42 || mxh != 42)
    {
        std::cerr << "Unable to set_default_maximum_image_size: 42, 42 -> "
                  << mxw << ", " << mxh << std::endl;
        EXRCORE_TEST (false);
    }
    exr_set_default_maximum_image_size (-1, -1);
    exr_get_default_maximum_image_size (&mxw, &mxh);
    if (mxw != 42 || mxh != 42)
    {
        std::cerr
            << "Invalid request not ignored to set_default_maximum_image_size: 42, 42 -> "
            << mxw << ", " << mxh << std::endl;
        EXRCORE_TEST (false);
    }

    exr_set_default_maximum_image_size (84, -1);
    exr_get_default_maximum_image_size (&mxw, &mxh);
    if (mxw != 42 || mxh != 42)
    {
        std::cerr
            << "Invalid request not ignored to set_default_maximum_image_size: 42, 42 -> "
            << mxw << ", " << mxh << std::endl;
        EXRCORE_TEST (false);
    }

    exr_set_default_maximum_image_size (-1, 84);
    exr_get_default_maximum_image_size (&mxw, &mxh);
    if (mxw != 42 || mxh != 42)
    {
        std::cerr
            << "Invalid request not ignored to set_default_maximum_image_size: 42, 42 -> "
            << mxw << ", " << mxh << std::endl;
        EXRCORE_TEST (false);
    }

    exr_set_default_maximum_tile_size (128, 128);
    exr_get_default_maximum_tile_size (&mxw, &mxh);
    if (mxw != 128 || mxh != 128)
    {
        std::cerr << "Unable to set_default_maximum_tile_size: 128, 128 -> "
                  << mxw << ", " << mxh << std::endl;
        EXRCORE_TEST (false);
    }
    exr_set_default_maximum_tile_size (-1, -1);
    exr_get_default_maximum_tile_size (&mxw, &mxh);
    if (mxw != 128 || mxh != 128)
    {
        std::cerr
            << "Invalid request not ignored to set_default_maximum_image_size: 128, 128 -> "
            << mxw << ", " << mxh << std::endl;
        EXRCORE_TEST (false);
    }
    exr_set_default_maximum_tile_size (84, -1);
    exr_get_default_maximum_tile_size (&mxw, &mxh);
    if (mxw != 128 || mxh != 128)
    {
        std::cerr
            << "Invalid request not ignored to set_default_maximum_image_size: 128, 128 -> "
            << mxw << ", " << mxh << std::endl;
        EXRCORE_TEST (false);
    }
    exr_set_default_maximum_tile_size (-1, 84);
    exr_get_default_maximum_tile_size (&mxw, &mxh);
    if (mxw != 128 || mxh != 128)
    {
        std::cerr
            << "Invalid request not ignored to set_default_maximum_image_size: 128, 128 -> "
            << mxw << ", " << mxh << std::endl;
        EXRCORE_TEST (false);
    }
    exr_set_default_maximum_image_size (0, 0);
    exr_set_default_maximum_tile_size (0, 0);
}